

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdDecomposeDoubleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  long lVar1;
  long lVar2;
  word wVar3;
  __time_t _Var4;
  char cVar5;
  int i;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined8 *puVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  word *pwVar16;
  long lVar17;
  char (*pacVar18) [32];
  long lVar19;
  timespec *ptVar20;
  ulong *puVar21;
  long lVar22;
  int u;
  ulong uVar23;
  int iVar24;
  __time_t *p_Var25;
  ulong *puVar26;
  word *pwVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  int nVars_00;
  bool bVar31;
  char pBuffer [10];
  timespec ts;
  char local_4b0 [16];
  long local_4a0;
  long local_498;
  char (*local_490) [32];
  int local_488;
  uint local_484;
  __time_t *local_480;
  ulong *local_478;
  ulong *local_470;
  __time_t *local_468;
  __time_t *local_460;
  ulong *local_458;
  __time_t *local_450;
  long local_448;
  char (*local_440) [8];
  timespec local_438 [32];
  ulong local_238 [65];
  
  iVar6 = clock_gettime(3,local_438);
  if (iVar6 < 0) {
    local_498 = 1;
  }
  else {
    lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_438[0].tv_nsec),8);
    local_498 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_438[0].tv_sec * -1000000;
  }
  pacVar18 = p->Cache;
  local_440 = p->pVarDefs;
  local_490 = pacVar18;
  do {
    uVar29 = nVars - 2;
    local_488 = 1;
    if (nVars < 1) {
      local_488 = nVars;
    }
    local_488 = local_488 + -1;
    lVar19 = (long)nVars;
    while (uVar12 = (ulong)uVar29, iVar6 = local_488, 1 < lVar19) {
      lVar1 = lVar19 + -7;
      uVar7 = 1 << ((byte)lVar1 & 0x1f);
      iVar24 = 2 << ((byte)lVar1 & 0x1f);
      lVar2 = lVar19 + -1;
      local_4a0 = (long)(int)uVar7;
      uVar23 = 1;
      if (1 < (int)uVar7) {
        uVar23 = (ulong)uVar7;
      }
      local_448 = local_4a0 * 8;
      local_450 = &local_438[0].tv_sec + local_4a0;
      local_458 = local_238 + local_4a0;
      local_478 = local_238 + local_4a0;
      local_460 = &local_438[0].tv_sec + local_4a0;
      local_480 = &local_438[0].tv_sec + local_4a0;
      local_468 = &local_438[0].tv_sec + local_4a0;
      bVar31 = true;
      local_470 = local_238 + local_4a0;
      nVars_00 = nVars;
      local_484 = uVar29;
      do {
        iVar6 = (int)lVar2;
        u = (int)uVar12;
        nVars = nVars_00;
        if (pacVar18[pVars[lVar2]][pVars[uVar12]] == '\0') {
          local_4b0[8] = '\0';
          local_4b0[9] = '\0';
          uVar29 = 1 << ((char)nVars_00 - 6U & 0x1f);
          local_4b0[0] = '\0';
          local_4b0[1] = '\0';
          local_4b0[2] = '\0';
          local_4b0[3] = '\0';
          local_4b0[4] = '\0';
          local_4b0[5] = '\0';
          local_4b0[6] = '\0';
          local_4b0[7] = '\0';
          if (nVars_00 < 7) {
            uVar29 = 1;
          }
          iVar8 = Dau_DsdFindSupportOne(p,pTruth,pVars,nVars_00,iVar6,u);
          if (lVar2 <= u) {
            __assert_fail("v > u",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                          ,0x647,
                          "int Dau_DsdDecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                         );
          }
          bVar13 = (byte)uVar12;
          bVar15 = (byte)(1 << ((byte)lVar2 & 0x1f));
          if (iVar8 == 1) {
            iVar8 = Abc_TtCheckEqualCofs(pTruth,uVar29,u,iVar6,0,3);
            if (iVar8 == 0) {
              iVar8 = Abc_TtCheckEqualCofs(pTruth,uVar29,u,iVar6,1,3);
              if (iVar8 == 0) goto LAB_0049bbb2;
              sprintf(local_4b0,"(!%c!%c)",(ulong)(pVars[lVar2] + 0x61));
              if (uVar29 == 1) {
                local_438[0].tv_sec =
                     (s_Truths6[lVar2] & *pTruth) >> (bVar15 & 0x3f) | s_Truths6[lVar2] & *pTruth;
              }
              else if (lVar19 < 7) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6[lVar2];
                  uVar28 = 0;
                  do {
                    (&local_438[0].tv_sec)[uVar28] =
                         (pTruth[uVar28] & uVar10) >> (bVar15 & 0x3f) | pTruth[uVar28] & uVar10;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                ptVar20 = local_438;
                pwVar16 = pTruth;
                do {
                  if (lVar1 != 0x1f) {
                    uVar10 = 0;
                    do {
                      _Var4 = *(__time_t *)((long)pwVar16 + uVar10 * 8 + local_448);
                      (&ptVar20->tv_sec)[uVar10] = _Var4;
                      *(__time_t *)((long)&ptVar20->tv_sec + uVar10 * 8 + local_448) = _Var4;
                      uVar10 = uVar10 + 1;
                    } while (uVar23 != uVar10);
                  }
                  pwVar16 = pwVar16 + iVar24;
                  ptVar20 = (timespec *)(&ptVar20->tv_sec + iVar24);
                } while (pwVar16 < pTruth + (int)uVar29);
              }
              if (uVar29 == 1) {
                local_438[0].tv_sec =
                     (s_Truths6[uVar12] & local_438[0].tv_sec) >>
                     ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | s_Truths6[uVar12] & local_438[0].tv_sec
                ;
              }
              else if (u < 6) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6[uVar12];
                  uVar28 = 0;
                  do {
                    uVar30 = (&local_438[0].tv_sec)[uVar28] & uVar10;
                    (&local_438[0].tv_sec)[uVar28] =
                         uVar30 >> ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | uVar30;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                bVar14 = (byte)(u + -6);
                uVar7 = 1 << (bVar14 & 0x1f);
                uVar10 = 1;
                if (1 < (int)uVar7) {
                  uVar10 = (ulong)uVar7;
                }
                ptVar20 = local_438;
                do {
                  if (u + -6 != 0x1f) {
                    uVar28 = 0;
                    do {
                      (&ptVar20->tv_sec)[uVar28] = (&ptVar20->tv_sec)[(long)(int)uVar7 + uVar28];
                      uVar28 = uVar28 + 1;
                    } while (uVar10 != uVar28);
                  }
                  ptVar20 = (timespec *)(&ptVar20->tv_sec + (2 << (bVar14 & 0x1f)));
                } while (ptVar20 < (timespec *)(&local_438[0].tv_sec + (int)uVar29));
              }
              if (uVar29 == 1) {
                local_238[0] = (s_Truths6Neg[lVar2] & *pTruth) << (bVar15 & 0x3f) |
                               s_Truths6Neg[lVar2] & *pTruth;
              }
              else if (lVar19 < 7) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6Neg[lVar2];
                  uVar28 = 0;
                  do {
                    local_238[uVar28] =
                         (pTruth[uVar28] & uVar10) << (bVar15 & 0x3f) | pTruth[uVar28] & uVar10;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                pwVar16 = pTruth;
                puVar21 = local_238;
                puVar26 = local_478;
                do {
                  if (lVar1 != 0x1f) {
                    uVar10 = 0;
                    do {
                      uVar28 = pwVar16[uVar10];
                      puVar21[uVar10] = uVar28;
                      puVar26[uVar10] = uVar28;
                      uVar10 = uVar10 + 1;
                    } while (uVar23 != uVar10);
                  }
                  pwVar16 = pwVar16 + iVar24;
                  puVar26 = puVar26 + iVar24;
                  puVar21 = puVar21 + iVar24;
                } while (pwVar16 < pTruth + (int)uVar29);
              }
              if (uVar29 == 1) {
                local_238[0] = (s_Truths6Neg[uVar12] & local_238[0]) <<
                               ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                               s_Truths6Neg[uVar12] & local_238[0];
              }
              else if (u < 6) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6Neg[uVar12];
                  uVar28 = 0;
                  do {
                    local_238[uVar28] =
                         (local_238[uVar28] & uVar10) << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                         local_238[uVar28] & uVar10;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                bVar15 = (byte)(u + -6);
                uVar7 = 1 << (bVar15 & 0x1f);
                iVar8 = 2 << (bVar15 & 0x1f);
                uVar10 = 1;
                if (1 < (int)uVar7) {
                  uVar10 = (ulong)uVar7;
                }
                puVar21 = local_238 + (int)uVar7;
                puVar26 = local_238;
                do {
                  if (u + -6 != 0x1f) {
                    uVar28 = 0;
                    do {
                      puVar21[uVar28] = puVar26[uVar28];
                      uVar28 = uVar28 + 1;
                    } while (uVar10 != uVar28);
                  }
                  puVar26 = puVar26 + iVar8;
                  puVar21 = puVar21 + iVar8;
                } while (puVar26 < local_238 + (int)uVar29);
              }
              if (Dau_DsdTtElems_pTtElems == 0) {
                puVar9 = &Dau_DsdTtElems_TtElems;
                lVar17 = 0;
                do {
                  *(undefined8 **)((long)&Dau_DsdTtElems_pTtElems + lVar17) = puVar9;
                  lVar17 = lVar17 + 8;
                  puVar9 = puVar9 + 0x40;
                } while (lVar17 != 0x68);
                uVar10 = 0;
                do {
                  if (uVar10 < 6) {
                    lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar10];
                    lVar22 = 0;
                    do {
                      *(word *)(lVar17 + lVar22 * 8) = s_Truths6[uVar10];
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 0x40);
                  }
                  else {
                    lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar10];
                    lVar22 = 0;
                    do {
                      *(ulong *)(lVar17 + lVar22 * 8) =
                           -(ulong)((1 << ((char)uVar10 - 6U & 0x1f) & (uint)lVar22) != 0);
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 0x40);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 != 0xc);
              }
              if (0 < (int)uVar29) {
                lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar12];
                uVar10 = 0;
                do {
                  pTruth[uVar10] =
                       (local_238[uVar10] ^ (&local_438[0].tv_sec)[uVar10]) &
                       *(ulong *)(lVar17 + uVar10 * 8) ^ (&local_438[0].tv_sec)[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar29 != uVar10);
              }
            }
            else {
              sprintf(local_4b0,"(!%c%c)",(ulong)(pVars[lVar2] + 0x61));
              if (uVar29 == 1) {
                local_438[0].tv_sec =
                     (s_Truths6Neg[lVar2] & *pTruth) << (bVar15 & 0x3f) |
                     s_Truths6Neg[lVar2] & *pTruth;
              }
              else if (lVar19 < 7) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6Neg[lVar2];
                  uVar28 = 0;
                  do {
                    (&local_438[0].tv_sec)[uVar28] =
                         (pTruth[uVar28] & uVar10) << (bVar15 & 0x3f) | pTruth[uVar28] & uVar10;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                ptVar20 = local_438;
                pwVar16 = pTruth;
                p_Var25 = local_450;
                do {
                  if (lVar1 != 0x1f) {
                    uVar10 = 0;
                    do {
                      wVar3 = pwVar16[uVar10];
                      (&ptVar20->tv_sec)[uVar10] = wVar3;
                      p_Var25[uVar10] = wVar3;
                      uVar10 = uVar10 + 1;
                    } while (uVar23 != uVar10);
                  }
                  pwVar16 = pwVar16 + iVar24;
                  p_Var25 = p_Var25 + iVar24;
                  ptVar20 = (timespec *)(&ptVar20->tv_sec + iVar24);
                } while (pwVar16 < pTruth + (int)uVar29);
              }
              if (uVar29 == 1) {
                local_438[0].tv_sec =
                     (s_Truths6Neg[uVar12] & local_438[0].tv_sec) <<
                     ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                     s_Truths6Neg[uVar12] & local_438[0].tv_sec;
              }
              else if (u < 6) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6Neg[uVar12];
                  uVar28 = 0;
                  do {
                    uVar30 = (&local_438[0].tv_sec)[uVar28] & uVar10;
                    (&local_438[0].tv_sec)[uVar28] =
                         uVar30 << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | uVar30;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                bVar14 = (byte)(u + -6);
                uVar7 = 1 << (bVar14 & 0x1f);
                iVar8 = 2 << (bVar14 & 0x1f);
                uVar10 = 1;
                if (1 < (int)uVar7) {
                  uVar10 = (ulong)uVar7;
                }
                p_Var25 = &local_438[0].tv_sec + (int)uVar7;
                ptVar20 = local_438;
                do {
                  if (u + -6 != 0x1f) {
                    uVar28 = 0;
                    do {
                      p_Var25[uVar28] = (&ptVar20->tv_sec)[uVar28];
                      uVar28 = uVar28 + 1;
                    } while (uVar10 != uVar28);
                  }
                  ptVar20 = (timespec *)(&ptVar20->tv_sec + iVar8);
                  p_Var25 = p_Var25 + iVar8;
                } while (ptVar20 < (timespec *)(&local_438[0].tv_sec + (int)uVar29));
              }
              if (uVar29 == 1) {
                local_238[0] = (s_Truths6Neg[lVar2] & *pTruth) << (bVar15 & 0x3f) |
                               s_Truths6Neg[lVar2] & *pTruth;
              }
              else if (lVar19 < 7) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6Neg[lVar2];
                  uVar28 = 0;
                  do {
                    local_238[uVar28] =
                         (pTruth[uVar28] & uVar10) << (bVar15 & 0x3f) | pTruth[uVar28] & uVar10;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                pwVar16 = pTruth;
                puVar21 = local_238;
                puVar26 = local_458;
                do {
                  if (lVar1 != 0x1f) {
                    uVar10 = 0;
                    do {
                      uVar28 = pwVar16[uVar10];
                      puVar21[uVar10] = uVar28;
                      puVar26[uVar10] = uVar28;
                      uVar10 = uVar10 + 1;
                    } while (uVar23 != uVar10);
                  }
                  pwVar16 = pwVar16 + iVar24;
                  puVar26 = puVar26 + iVar24;
                  puVar21 = puVar21 + iVar24;
                } while (pwVar16 < pTruth + (int)uVar29);
              }
              if (uVar29 == 1) {
                local_238[0] = (s_Truths6[uVar12] & local_238[0]) >>
                               ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                               s_Truths6[uVar12] & local_238[0];
              }
              else if (u < 6) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6[uVar12];
                  uVar28 = 0;
                  do {
                    local_238[uVar28] =
                         (local_238[uVar28] & uVar10) >> ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                         local_238[uVar28] & uVar10;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                bVar15 = (byte)(u + -6);
                uVar7 = 1 << (bVar15 & 0x1f);
                uVar10 = 1;
                if (1 < (int)uVar7) {
                  uVar10 = (ulong)uVar7;
                }
                puVar21 = local_238;
                do {
                  if (u + -6 != 0x1f) {
                    uVar28 = 0;
                    do {
                      puVar21[uVar28] = puVar21[(long)(int)uVar7 + uVar28];
                      uVar28 = uVar28 + 1;
                    } while (uVar10 != uVar28);
                  }
                  puVar21 = puVar21 + (2 << (bVar15 & 0x1f));
                } while (puVar21 < local_238 + (int)uVar29);
              }
              if (Dau_DsdTtElems_pTtElems == 0) {
                puVar9 = &Dau_DsdTtElems_TtElems;
                lVar17 = 0;
                do {
                  *(undefined8 **)((long)&Dau_DsdTtElems_pTtElems + lVar17) = puVar9;
                  lVar17 = lVar17 + 8;
                  puVar9 = puVar9 + 0x40;
                } while (lVar17 != 0x68);
                uVar10 = 0;
                do {
                  if (uVar10 < 6) {
                    lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar10];
                    lVar22 = 0;
                    do {
                      *(word *)(lVar17 + lVar22 * 8) = s_Truths6[uVar10];
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 0x40);
                  }
                  else {
                    lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar10];
                    lVar22 = 0;
                    do {
                      *(ulong *)(lVar17 + lVar22 * 8) =
                           -(ulong)((1 << ((char)uVar10 - 6U & 0x1f) & (uint)lVar22) != 0);
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 0x40);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 != 0xc);
              }
              if (0 < (int)uVar29) {
                lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar12];
                uVar10 = 0;
                do {
                  pTruth[uVar10] =
                       (local_238[uVar10] ^ (&local_438[0].tv_sec)[uVar10]) &
                       *(ulong *)(lVar17 + uVar10 * 8) ^ (&local_438[0].tv_sec)[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar29 != uVar10);
              }
            }
LAB_0049ba87:
            if (local_4b0[0] == '\0') {
              __assert_fail("pBuffer[0]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                            ,0x699,
                            "int Dau_DsdDecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                           );
            }
            sVar11 = strlen(local_4b0);
            if (7 < sVar11) {
              __assert_fail("strlen(pStr) < 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                            ,0x445,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
            }
            uVar29 = p->nVarsUsed;
            uVar10 = (ulong)uVar29;
            if (0x1f < (int)uVar29) {
              __assert_fail("p->nVarsUsed < 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                            ,0x446,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
            }
            if (0 < (int)uVar29) {
              lVar17 = 0;
              do {
                local_490[(int)uVar10][lVar17] = '\0';
                lVar17 = lVar17 + 1;
                uVar10 = (ulong)p->nVarsUsed;
              } while (lVar17 < (long)uVar10);
            }
            uVar29 = p->nVarsUsed;
            uVar10 = (ulong)uVar29;
            if (0 < (int)uVar29) {
              lVar17 = 0;
              pacVar18 = local_490;
              do {
                (*pacVar18)[(int)uVar10] = '\0';
                lVar17 = lVar17 + 1;
                uVar29 = p->nVarsUsed;
                uVar10 = (ulong)(int)uVar29;
                pacVar18 = pacVar18 + 1;
              } while (lVar17 < (long)uVar10);
            }
            p->nVarsUsed = uVar29 + 1;
            strcpy(local_440[(int)uVar29],local_4b0);
            pVars[uVar12] = p->nVarsUsed + -1;
            nVars = nVars_00 + -1;
            pVars[lVar2] = pVars[(long)nVars_00 + -1];
            Abc_TtSwapVars(pTruth,nVars_00,iVar6,nVars);
            iVar8 = Dau_DsdDecomposeSingleVarOne(p,pTruth,pVars,nVars,u);
            if (iVar8 != 0) {
              nVars = Dau_DsdDecomposeSingleVar(p,pTruth,pVars,nVars_00 + -2);
            }
          }
          else {
            if (iVar8 == 2) {
              iVar8 = Abc_TtCheckEqualCofs(pTruth,uVar29,u,iVar6,0,2);
              if (iVar8 == 0) {
                iVar8 = Abc_TtCheckEqualCofs(pTruth,uVar29,u,iVar6,0,3);
                if (iVar8 == 0) goto LAB_0049bbb2;
                sprintf(local_4b0,"(%c!%c)",(ulong)(pVars[lVar2] + 0x61));
                if (uVar29 == 1) {
                  local_438[0].tv_sec =
                       (s_Truths6Neg[lVar2] & *pTruth) << (bVar15 & 0x3f) |
                       s_Truths6Neg[lVar2] & *pTruth;
                }
                else if (lVar19 < 7) {
                  if (0 < (int)uVar29) {
                    uVar10 = s_Truths6Neg[lVar2];
                    uVar28 = 0;
                    do {
                      (&local_438[0].tv_sec)[uVar28] =
                           (pTruth[uVar28] & uVar10) << (bVar15 & 0x3f) | pTruth[uVar28] & uVar10;
                      uVar28 = uVar28 + 1;
                    } while (uVar29 != uVar28);
                  }
                }
                else if (0 < (int)uVar29) {
                  ptVar20 = local_438;
                  pwVar16 = pTruth;
                  p_Var25 = local_480;
                  do {
                    if (lVar1 != 0x1f) {
                      uVar10 = 0;
                      do {
                        wVar3 = pwVar16[uVar10];
                        (&ptVar20->tv_sec)[uVar10] = wVar3;
                        p_Var25[uVar10] = wVar3;
                        uVar10 = uVar10 + 1;
                      } while (uVar23 != uVar10);
                    }
                    pwVar16 = pwVar16 + iVar24;
                    p_Var25 = p_Var25 + iVar24;
                    ptVar20 = (timespec *)(&ptVar20->tv_sec + iVar24);
                  } while (pwVar16 < pTruth + (int)uVar29);
                }
                if (uVar29 == 1) {
                  local_438[0].tv_sec =
                       (s_Truths6Neg[uVar12] & local_438[0].tv_sec) <<
                       ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                       s_Truths6Neg[uVar12] & local_438[0].tv_sec;
                }
                else if (u < 6) {
                  if (0 < (int)uVar29) {
                    uVar10 = s_Truths6Neg[uVar12];
                    uVar28 = 0;
                    do {
                      uVar30 = (&local_438[0].tv_sec)[uVar28] & uVar10;
                      (&local_438[0].tv_sec)[uVar28] =
                           uVar30 << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | uVar30;
                      uVar28 = uVar28 + 1;
                    } while (uVar29 != uVar28);
                  }
                }
                else if (0 < (int)uVar29) {
                  bVar14 = (byte)(u + -6);
                  uVar7 = 1 << (bVar14 & 0x1f);
                  iVar8 = 2 << (bVar14 & 0x1f);
                  uVar10 = 1;
                  if (1 < (int)uVar7) {
                    uVar10 = (ulong)uVar7;
                  }
                  p_Var25 = &local_438[0].tv_sec + (int)uVar7;
                  ptVar20 = local_438;
                  do {
                    if (u + -6 != 0x1f) {
                      uVar28 = 0;
                      do {
                        p_Var25[uVar28] = (&ptVar20->tv_sec)[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar10 != uVar28);
                    }
                    ptVar20 = (timespec *)(&ptVar20->tv_sec + iVar8);
                    p_Var25 = p_Var25 + iVar8;
                  } while (ptVar20 < (timespec *)(&local_438[0].tv_sec + (int)uVar29));
                }
                if (uVar29 == 1) {
                  local_238[0] = (s_Truths6[lVar2] & *pTruth) >> (bVar15 & 0x3f) |
                                 s_Truths6[lVar2] & *pTruth;
                }
                else if (lVar19 < 7) {
                  if (0 < (int)uVar29) {
                    uVar10 = s_Truths6[lVar2];
                    uVar28 = 0;
                    do {
                      local_238[uVar28] =
                           (pTruth[uVar28] & uVar10) >> (bVar15 & 0x3f) | pTruth[uVar28] & uVar10;
                      uVar28 = uVar28 + 1;
                    } while (uVar29 != uVar28);
                  }
                }
                else if (0 < (int)uVar29) {
                  pwVar16 = pTruth;
                  puVar21 = local_238;
                  do {
                    pwVar27 = pwVar16;
                    puVar26 = puVar21;
                    uVar10 = uVar23;
                    if (lVar1 != 0x1f) {
                      do {
                        uVar28 = pwVar27[local_4a0];
                        *puVar26 = uVar28;
                        puVar26[local_4a0] = uVar28;
                        uVar10 = uVar10 - 1;
                        pwVar27 = pwVar27 + 1;
                        puVar26 = puVar26 + 1;
                      } while (uVar10 != 0);
                    }
                    pwVar16 = pwVar16 + iVar24;
                    puVar21 = puVar21 + iVar24;
                  } while (pwVar16 < pTruth + (int)uVar29);
                }
                if (uVar29 == 1) {
                  local_238[0] = (s_Truths6Neg[uVar12] & local_238[0]) <<
                                 ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                                 s_Truths6Neg[uVar12] & local_238[0];
                }
                else if (u < 6) {
                  if (0 < (int)uVar29) {
                    uVar10 = s_Truths6Neg[uVar12];
                    uVar28 = 0;
                    do {
                      local_238[uVar28] =
                           (local_238[uVar28] & uVar10) << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                           local_238[uVar28] & uVar10;
                      uVar28 = uVar28 + 1;
                    } while (uVar29 != uVar28);
                  }
                }
                else if (0 < (int)uVar29) {
                  bVar15 = (byte)(u + -6);
                  uVar7 = 1 << (bVar15 & 0x1f);
                  iVar8 = 2 << (bVar15 & 0x1f);
                  uVar10 = 1;
                  if (1 < (int)uVar7) {
                    uVar10 = (ulong)uVar7;
                  }
                  puVar21 = local_238 + (int)uVar7;
                  puVar26 = local_238;
                  do {
                    if (u + -6 != 0x1f) {
                      uVar28 = 0;
                      do {
                        puVar21[uVar28] = puVar26[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar10 != uVar28);
                    }
                    puVar26 = puVar26 + iVar8;
                    puVar21 = puVar21 + iVar8;
                  } while (puVar26 < local_238 + (int)uVar29);
                }
                if (Dau_DsdTtElems_pTtElems == 0) {
                  puVar9 = &Dau_DsdTtElems_TtElems;
                  lVar17 = 0;
                  do {
                    *(undefined8 **)((long)&Dau_DsdTtElems_pTtElems + lVar17) = puVar9;
                    lVar17 = lVar17 + 8;
                    puVar9 = puVar9 + 0x40;
                  } while (lVar17 != 0x68);
                  uVar10 = 0;
                  do {
                    if (uVar10 < 6) {
                      lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar10];
                      lVar22 = 0;
                      do {
                        *(word *)(lVar17 + lVar22 * 8) = s_Truths6[uVar10];
                        lVar22 = lVar22 + 1;
                      } while (lVar22 != 0x40);
                    }
                    else {
                      lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar10];
                      lVar22 = 0;
                      do {
                        *(ulong *)(lVar17 + lVar22 * 8) =
                             -(ulong)((1 << ((char)uVar10 - 6U & 0x1f) & (uint)lVar22) != 0);
                        lVar22 = lVar22 + 1;
                      } while (lVar22 != 0x40);
                    }
                    uVar10 = uVar10 + 1;
                  } while (uVar10 != 0xc);
                }
                if (0 < (int)uVar29) {
                  lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar12];
                  uVar10 = 0;
                  do {
                    pTruth[uVar10] =
                         (local_238[uVar10] ^ (&local_438[0].tv_sec)[uVar10]) &
                         *(ulong *)(lVar17 + uVar10 * 8) ^ (&local_438[0].tv_sec)[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar29 != uVar10);
                }
              }
              else {
                sprintf(local_4b0,"(%c%c)",(ulong)(pVars[lVar2] + 0x61));
                if (uVar29 == 1) {
                  local_438[0].tv_sec =
                       (s_Truths6Neg[lVar2] & *pTruth) << (bVar15 & 0x3f) |
                       s_Truths6Neg[lVar2] & *pTruth;
                }
                else if (lVar19 < 7) {
                  if (0 < (int)uVar29) {
                    uVar10 = s_Truths6Neg[lVar2];
                    uVar28 = 0;
                    do {
                      (&local_438[0].tv_sec)[uVar28] =
                           (pTruth[uVar28] & uVar10) << (bVar15 & 0x3f) | pTruth[uVar28] & uVar10;
                      uVar28 = uVar28 + 1;
                    } while (uVar29 != uVar28);
                  }
                }
                else if (0 < (int)uVar29) {
                  ptVar20 = local_438;
                  pwVar16 = pTruth;
                  p_Var25 = local_460;
                  do {
                    if (lVar1 != 0x1f) {
                      uVar10 = 0;
                      do {
                        wVar3 = pwVar16[uVar10];
                        (&ptVar20->tv_sec)[uVar10] = wVar3;
                        p_Var25[uVar10] = wVar3;
                        uVar10 = uVar10 + 1;
                      } while (uVar23 != uVar10);
                    }
                    pwVar16 = pwVar16 + iVar24;
                    p_Var25 = p_Var25 + iVar24;
                    ptVar20 = (timespec *)(&ptVar20->tv_sec + iVar24);
                  } while (pwVar16 < pTruth + (int)uVar29);
                }
                if (uVar29 == 1) {
                  local_438[0].tv_sec =
                       (s_Truths6Neg[uVar12] & local_438[0].tv_sec) <<
                       ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                       s_Truths6Neg[uVar12] & local_438[0].tv_sec;
                }
                else if (u < 6) {
                  if (0 < (int)uVar29) {
                    uVar10 = s_Truths6Neg[uVar12];
                    uVar28 = 0;
                    do {
                      uVar30 = (&local_438[0].tv_sec)[uVar28] & uVar10;
                      (&local_438[0].tv_sec)[uVar28] =
                           uVar30 << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | uVar30;
                      uVar28 = uVar28 + 1;
                    } while (uVar29 != uVar28);
                  }
                }
                else if (0 < (int)uVar29) {
                  bVar14 = (byte)(u + -6);
                  uVar7 = 1 << (bVar14 & 0x1f);
                  iVar8 = 2 << (bVar14 & 0x1f);
                  uVar10 = 1;
                  if (1 < (int)uVar7) {
                    uVar10 = (ulong)uVar7;
                  }
                  p_Var25 = &local_438[0].tv_sec + (int)uVar7;
                  ptVar20 = local_438;
                  do {
                    if (u + -6 != 0x1f) {
                      uVar28 = 0;
                      do {
                        p_Var25[uVar28] = (&ptVar20->tv_sec)[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar10 != uVar28);
                    }
                    ptVar20 = (timespec *)(&ptVar20->tv_sec + iVar8);
                    p_Var25 = p_Var25 + iVar8;
                  } while (ptVar20 < (timespec *)(&local_438[0].tv_sec + (int)uVar29));
                }
                if (uVar29 == 1) {
                  local_238[0] = (s_Truths6[lVar2] & *pTruth) >> (bVar15 & 0x3f) |
                                 s_Truths6[lVar2] & *pTruth;
                }
                else if (lVar19 < 7) {
                  if (0 < (int)uVar29) {
                    uVar10 = s_Truths6[lVar2];
                    uVar28 = 0;
                    do {
                      local_238[uVar28] =
                           (pTruth[uVar28] & uVar10) >> (bVar15 & 0x3f) | pTruth[uVar28] & uVar10;
                      uVar28 = uVar28 + 1;
                    } while (uVar29 != uVar28);
                  }
                }
                else if (0 < (int)uVar29) {
                  pwVar16 = pTruth;
                  puVar21 = local_238;
                  do {
                    pwVar27 = pwVar16;
                    puVar26 = puVar21;
                    uVar10 = uVar23;
                    if (lVar1 != 0x1f) {
                      do {
                        uVar28 = pwVar27[local_4a0];
                        *puVar26 = uVar28;
                        puVar26[local_4a0] = uVar28;
                        uVar10 = uVar10 - 1;
                        pwVar27 = pwVar27 + 1;
                        puVar26 = puVar26 + 1;
                      } while (uVar10 != 0);
                    }
                    pwVar16 = pwVar16 + iVar24;
                    puVar21 = puVar21 + iVar24;
                  } while (pwVar16 < pTruth + (int)uVar29);
                }
                if (uVar29 == 1) {
                  local_238[0] = (s_Truths6[uVar12] & local_238[0]) >>
                                 ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                                 s_Truths6[uVar12] & local_238[0];
                }
                else if (u < 6) {
                  if (0 < (int)uVar29) {
                    uVar10 = s_Truths6[uVar12];
                    uVar28 = 0;
                    do {
                      local_238[uVar28] =
                           (local_238[uVar28] & uVar10) >> ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                           local_238[uVar28] & uVar10;
                      uVar28 = uVar28 + 1;
                    } while (uVar29 != uVar28);
                  }
                }
                else if (0 < (int)uVar29) {
                  bVar15 = (byte)(u + -6);
                  uVar7 = 1 << (bVar15 & 0x1f);
                  uVar10 = 1;
                  if (1 < (int)uVar7) {
                    uVar10 = (ulong)uVar7;
                  }
                  puVar21 = local_238;
                  do {
                    if (u + -6 != 0x1f) {
                      uVar28 = 0;
                      do {
                        puVar21[uVar28] = puVar21[(long)(int)uVar7 + uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar10 != uVar28);
                    }
                    puVar21 = puVar21 + (2 << (bVar15 & 0x1f));
                  } while (puVar21 < local_238 + (int)uVar29);
                }
                if (Dau_DsdTtElems_pTtElems == 0) {
                  puVar9 = &Dau_DsdTtElems_TtElems;
                  lVar17 = 0;
                  do {
                    *(undefined8 **)((long)&Dau_DsdTtElems_pTtElems + lVar17) = puVar9;
                    lVar17 = lVar17 + 8;
                    puVar9 = puVar9 + 0x40;
                  } while (lVar17 != 0x68);
                  uVar10 = 0;
                  do {
                    if (uVar10 < 6) {
                      lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar10];
                      lVar22 = 0;
                      do {
                        *(word *)(lVar17 + lVar22 * 8) = s_Truths6[uVar10];
                        lVar22 = lVar22 + 1;
                      } while (lVar22 != 0x40);
                    }
                    else {
                      lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar10];
                      lVar22 = 0;
                      do {
                        *(ulong *)(lVar17 + lVar22 * 8) =
                             -(ulong)((1 << ((char)uVar10 - 6U & 0x1f) & (uint)lVar22) != 0);
                        lVar22 = lVar22 + 1;
                      } while (lVar22 != 0x40);
                    }
                    uVar10 = uVar10 + 1;
                  } while (uVar10 != 0xc);
                }
                if (0 < (int)uVar29) {
                  lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar12];
                  uVar10 = 0;
                  do {
                    pTruth[uVar10] =
                         (local_238[uVar10] ^ (&local_438[0].tv_sec)[uVar10]) &
                         *(ulong *)(lVar17 + uVar10 * 8) ^ (&local_438[0].tv_sec)[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar29 != uVar10);
                }
              }
              goto LAB_0049ba87;
            }
            if (((iVar8 == 3) &&
                (iVar8 = Abc_TtCheckEqualCofs(pTruth,uVar29,u,iVar6,0,3), iVar8 != 0)) &&
               (iVar8 = Abc_TtCheckEqualCofs(pTruth,uVar29,u,iVar6,1,2), iVar8 != 0)) {
              sprintf(local_4b0,"[%c%c]",(ulong)(pVars[lVar2] + 0x61));
              if (uVar29 == 1) {
                local_438[0].tv_sec =
                     (s_Truths6Neg[lVar2] & *pTruth) << (bVar15 & 0x3f) |
                     s_Truths6Neg[lVar2] & *pTruth;
              }
              else if (lVar19 < 7) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6Neg[lVar2];
                  uVar28 = 0;
                  do {
                    (&local_438[0].tv_sec)[uVar28] =
                         (pTruth[uVar28] & uVar10) << (bVar15 & 0x3f) | pTruth[uVar28] & uVar10;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                ptVar20 = local_438;
                pwVar16 = pTruth;
                p_Var25 = local_468;
                do {
                  if (lVar1 != 0x1f) {
                    uVar10 = 0;
                    do {
                      wVar3 = pwVar16[uVar10];
                      (&ptVar20->tv_sec)[uVar10] = wVar3;
                      p_Var25[uVar10] = wVar3;
                      uVar10 = uVar10 + 1;
                    } while (uVar23 != uVar10);
                  }
                  pwVar16 = pwVar16 + iVar24;
                  p_Var25 = p_Var25 + iVar24;
                  ptVar20 = (timespec *)(&ptVar20->tv_sec + iVar24);
                } while (pwVar16 < pTruth + (int)uVar29);
              }
              if (uVar29 == 1) {
                local_438[0].tv_sec =
                     (s_Truths6Neg[uVar12] & local_438[0].tv_sec) <<
                     ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                     s_Truths6Neg[uVar12] & local_438[0].tv_sec;
              }
              else if (u < 6) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6Neg[uVar12];
                  uVar28 = 0;
                  do {
                    uVar30 = (&local_438[0].tv_sec)[uVar28] & uVar10;
                    (&local_438[0].tv_sec)[uVar28] =
                         uVar30 << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | uVar30;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                bVar14 = (byte)(u + -6);
                uVar7 = 1 << (bVar14 & 0x1f);
                iVar8 = 2 << (bVar14 & 0x1f);
                uVar10 = 1;
                if (1 < (int)uVar7) {
                  uVar10 = (ulong)uVar7;
                }
                p_Var25 = &local_438[0].tv_sec + (int)uVar7;
                ptVar20 = local_438;
                do {
                  if (u + -6 != 0x1f) {
                    uVar28 = 0;
                    do {
                      p_Var25[uVar28] = (&ptVar20->tv_sec)[uVar28];
                      uVar28 = uVar28 + 1;
                    } while (uVar10 != uVar28);
                  }
                  ptVar20 = (timespec *)(&ptVar20->tv_sec + iVar8);
                  p_Var25 = p_Var25 + iVar8;
                } while (ptVar20 < (timespec *)(&local_438[0].tv_sec + (int)uVar29));
              }
              if (uVar29 == 1) {
                local_238[0] = (s_Truths6Neg[lVar2] & *pTruth) << (bVar15 & 0x3f) |
                               s_Truths6Neg[lVar2] & *pTruth;
              }
              else if (lVar19 < 7) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6Neg[lVar2];
                  uVar28 = 0;
                  do {
                    local_238[uVar28] =
                         (pTruth[uVar28] & uVar10) << (bVar15 & 0x3f) | pTruth[uVar28] & uVar10;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                pwVar16 = pTruth;
                puVar21 = local_238;
                puVar26 = local_470;
                do {
                  if (lVar1 != 0x1f) {
                    uVar10 = 0;
                    do {
                      uVar28 = pwVar16[uVar10];
                      puVar21[uVar10] = uVar28;
                      puVar26[uVar10] = uVar28;
                      uVar10 = uVar10 + 1;
                    } while (uVar23 != uVar10);
                  }
                  pwVar16 = pwVar16 + iVar24;
                  puVar26 = puVar26 + iVar24;
                  puVar21 = puVar21 + iVar24;
                } while (pwVar16 < pTruth + (int)uVar29);
              }
              if (uVar29 == 1) {
                local_238[0] = (s_Truths6[uVar12] & local_238[0]) >>
                               ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                               s_Truths6[uVar12] & local_238[0];
              }
              else if (u < 6) {
                if (0 < (int)uVar29) {
                  uVar10 = s_Truths6[uVar12];
                  uVar28 = 0;
                  do {
                    local_238[uVar28] =
                         (local_238[uVar28] & uVar10) >> ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                         local_238[uVar28] & uVar10;
                    uVar28 = uVar28 + 1;
                  } while (uVar29 != uVar28);
                }
              }
              else if (0 < (int)uVar29) {
                bVar15 = (byte)(u + -6);
                uVar7 = 1 << (bVar15 & 0x1f);
                uVar10 = 1;
                if (1 < (int)uVar7) {
                  uVar10 = (ulong)uVar7;
                }
                puVar21 = local_238;
                do {
                  if (u + -6 != 0x1f) {
                    uVar28 = 0;
                    do {
                      puVar21[uVar28] = puVar21[(long)(int)uVar7 + uVar28];
                      uVar28 = uVar28 + 1;
                    } while (uVar10 != uVar28);
                  }
                  puVar21 = puVar21 + (2 << (bVar15 & 0x1f));
                } while (puVar21 < local_238 + (int)uVar29);
              }
              if (Dau_DsdTtElems_pTtElems == 0) {
                puVar9 = &Dau_DsdTtElems_TtElems;
                lVar17 = 0;
                do {
                  *(undefined8 **)((long)&Dau_DsdTtElems_pTtElems + lVar17) = puVar9;
                  lVar17 = lVar17 + 8;
                  puVar9 = puVar9 + 0x40;
                } while (lVar17 != 0x68);
                uVar10 = 0;
                do {
                  if (uVar10 < 6) {
                    lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar10];
                    lVar22 = 0;
                    do {
                      *(word *)(lVar17 + lVar22 * 8) = s_Truths6[uVar10];
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 0x40);
                  }
                  else {
                    lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar10];
                    lVar22 = 0;
                    do {
                      *(ulong *)(lVar17 + lVar22 * 8) =
                           -(ulong)((1 << ((char)uVar10 - 6U & 0x1f) & (uint)lVar22) != 0);
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 0x40);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 != 0xc);
              }
              if (0 < (int)uVar29) {
                lVar17 = (&Dau_DsdTtElems_pTtElems)[uVar12];
                uVar10 = 0;
                do {
                  pTruth[uVar10] =
                       (local_238[uVar10] ^ (&local_438[0].tv_sec)[uVar10]) &
                       *(ulong *)(lVar17 + uVar10 * 8) ^ (&local_438[0].tv_sec)[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar29 != uVar10);
              }
              goto LAB_0049ba87;
            }
          }
LAB_0049bbb2:
          if (nVars == 0) {
            iVar6 = clock_gettime(3,local_438);
            if (iVar6 < 0) {
              lVar19 = -1;
            }
            else {
              lVar19 = local_438[0].tv_nsec / 1000 + local_438[0].tv_sec * 1000000;
            }
            s_Times_1 = s_Times_1 + lVar19 + local_498;
            cVar5 = '\x01';
            nVars = 0;
            pacVar18 = local_490;
            goto LAB_0049bc92;
          }
          pacVar18 = local_490;
          if (nVars < nVars_00) break;
        }
        uVar12 = uVar12 - 1;
        bVar31 = 0 < u;
        nVars_00 = nVars;
      } while (0 < u);
      uVar29 = local_484 - 1;
      lVar19 = lVar2;
      if (bVar31) break;
    }
    cVar5 = (iVar6 == 0) * '\x03';
LAB_0049bc92:
    if (cVar5 != '\0') {
      if (cVar5 == '\x03') {
        iVar6 = clock_gettime(3,local_438);
        if (iVar6 < 0) {
          lVar19 = -1;
        }
        else {
          lVar19 = local_438[0].tv_nsec / 1000 + local_438[0].tv_sec * 1000000;
        }
        s_Times_1 = s_Times_1 + lVar19 + local_498;
      }
      else {
        nVars = 0;
      }
      return nVars;
    }
  } while( true );
}

Assistant:

int Dau_DsdDecomposeDoubleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v, u, nVarsOld;
        for ( v = nVars - 1; v > 0; v-- )
        {
            for ( u = v - 1; u >= 0; u-- )
            {
                if ( Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) )
                    continue;
                nVarsOld = nVars;
                nVars = Dau_DsdDecomposeDoubleVarsOne( p, pTruth, pVars, nVars, v, u );
                if ( nVars == 0 )
                {
                    s_Times[1] += Abc_Clock() - clk;
                    return 0;
                }
                if ( nVarsOld > nVars )
                    break;
            }
            if ( u >= 0 ) // found
                break;
        }
        if ( v == 0 ) // not found
            break;
    }
    s_Times[1] += Abc_Clock() - clk;
    return nVars;
}